

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

HRESULT __thiscall WScriptJsrt::ModuleMessage::Call(ModuleMessage *this,LPCSTR fileName)

{
  bool bVar1;
  HRESULT HVar2;
  mapped_type *pmVar3;
  char *filenameToLoad;
  pointer ppVar4;
  PAL_FILE *stream;
  LPCSTR pCVar5;
  bool bVar6;
  LPCSTR local_f0;
  LPCSTR local_e0;
  _Self local_78;
  _Self local_70;
  iterator actualModuleRecord;
  undefined1 local_58 [8];
  AutoString specifierStr;
  LPCSTR fileContent;
  JsValueRef pvStack_28;
  HRESULT hr;
  JsValueRef result;
  LPCSTR pCStack_18;
  JsErrorCode errorCode;
  LPCSTR fileName_local;
  ModuleMessage *this_local;
  
  result._4_4_ = JsNoError;
  pvStack_28 = (JsValueRef)0x0;
  pCStack_18 = fileName;
  fileName_local = (LPCSTR)this;
  if (this->specifier == (JsValueRef)0x0) {
    pmVar3 = std::
             map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
             ::operator[](&moduleErrMap,&this->moduleRecord);
    if ((*pmVar3 != ErroredModule) &&
       (result._4_4_ = ChakraRTInterface::JsModuleEvaluation
                                 (this->moduleRecord,&stack0xffffffffffffffd8),
       result._4_4_ != JsNoError)) {
      PrintException(pCStack_18,result._4_4_,(JsValueRef)0x0);
    }
  }
  else {
    specifierStr.errorCode = JsNoError;
    specifierStr.dontFree = false;
    specifierStr._29_3_ = 0;
    AutoString::AutoString((AutoString *)local_58,this->specifier);
    result._4_4_ = AutoString::GetError((AutoString *)local_58);
    if (result._4_4_ == JsNoError) {
      filenameToLoad = AutoString::operator*((AutoString *)local_58);
      HVar2 = Helpers::LoadScriptFromFile
                        (filenameToLoad,(LPCSTR *)&specifierStr.errorCode,(UINT *)0x0,this->fullPath
                         ,true);
      if (HVar2 < 0) {
        if ((HostConfigFlags::flags.MuteHostErrorMsgIsEnabled & 1U) == 0) {
          local_70._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
               ::find(&moduleRecordMap_abi_cxx11_,this->fullPath);
          local_78._M_node =
               (_Base_ptr)
               std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>_>
               ::end(&moduleRecordMap_abi_cxx11_);
          bVar1 = std::operator==(&local_70,&local_78);
          bVar6 = true;
          if (!bVar1) {
            ppVar4 = std::
                     _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*>_>
                     ::operator->(&local_70);
            pmVar3 = std::
                     map<void_*,_ModuleState,_std::less<void_*>,_std::allocator<std::pair<void_*const,_ModuleState>_>_>
                     ::operator[](&moduleErrMap,&ppVar4->second);
            bVar6 = *pmVar3 == RootModule;
          }
          if (bVar6) {
            stream = PAL_get_stderr(0);
            pCVar5 = AutoString::GetString((AutoString *)local_58);
            PAL_fprintf(stream,"Couldn\'t load file \'%s\'\n",pCVar5);
          }
        }
        if (this->fullPath == (string *)0x0) {
          local_e0 = AutoString::operator*((AutoString *)local_58);
        }
        else {
          local_e0 = (LPCSTR)std::__cxx11::string::c_str();
        }
        LoadScript((JsValueRef)0x0,local_e0,(LPCSTR)0x0,"module",true,FinalizeFree,false);
      }
      else {
        if (this->fullPath == (string *)0x0) {
          local_f0 = AutoString::operator*((AutoString *)local_58);
        }
        else {
          local_f0 = (LPCSTR)std::__cxx11::string::c_str();
        }
        LoadScript((JsValueRef)0x0,local_f0,(LPCSTR)specifierStr._24_8_,"module",true,FinalizeFree,
                   true);
      }
    }
    AutoString::~AutoString((AutoString *)local_58);
  }
  return result._4_4_;
}

Assistant:

HRESULT WScriptJsrt::ModuleMessage::Call(LPCSTR fileName)
{
    JsErrorCode errorCode = JsNoError;
    JsValueRef result = JS_INVALID_REFERENCE;
    HRESULT hr;
    if (specifier == nullptr)
    {
        if (moduleErrMap[moduleRecord] != ErroredModule)
        {
            errorCode = ChakraRTInterface::JsModuleEvaluation(moduleRecord, &result);
            if (errorCode != JsNoError)
            {
                PrintException(fileName, errorCode); // this should not be called
            }
        }
    }
    else
    {
        LPCSTR fileContent = nullptr;
        AutoString specifierStr(specifier);
        errorCode = specifierStr.GetError();
        if (errorCode == JsNoError)
        {
            hr = Helpers::LoadScriptFromFile(*specifierStr, fileContent, nullptr, fullPath, true);

            if (FAILED(hr))
            {
                if (!HostConfigFlags::flags.MuteHostErrorMsgIsEnabled)
                {
                    auto actualModuleRecord = moduleRecordMap.find(*fullPath);
                    if (actualModuleRecord == moduleRecordMap.end() || moduleErrMap[actualModuleRecord->second] == RootModule)
                    {
                        fprintf(stderr, "Couldn't load file '%s'\n", specifierStr.GetString());
                    }
                }
                LoadScript(nullptr, fullPath == nullptr ? *specifierStr : fullPath->c_str(), nullptr, "module", true, WScriptJsrt::FinalizeFree, false);
                goto Error;
            }
            LoadScript(nullptr, fullPath == nullptr ? *specifierStr : fullPath->c_str(), fileContent, "module", true, WScriptJsrt::FinalizeFree, true);
        }
    }
Error:
    return errorCode;
}